

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::getQuadratureWeights<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,double *weights)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  size_t sVar4;
  GridLocalPolynomial *pGVar5;
  GridLocalPolynomial *pGVar6;
  int iVar7;
  Data2D<int> *pDVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  ulong uVar16;
  Data2D<int> *pDVar17;
  MultiIndexSet *mset;
  long lVar18;
  bool bVar19;
  double dVar20;
  vector<bool,_std::allocator<bool>_> used;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  Data2D<int> lparents;
  vector<int,_std::allocator<int>_> level;
  allocator_type local_15a;
  bool local_159;
  Data2D<int> local_158;
  ulong local_130;
  GridLocalPolynomial *local_128;
  ulong local_120;
  ulong local_118;
  MultiIndexSet *local_110;
  Data2D<int> *local_108;
  long local_100;
  ulong local_f8;
  vector<double,_std::allocator<double>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  Data2D<int> local_a8;
  double *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  mset = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    mset = &(this->super_BaseCanonicalGrid).needed;
  }
  local_78 = weights;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x23])();
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_c0,(long)this->top_level + 1,(allocator_type *)&local_a8);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_d8,(long)this->top_level + 1,(allocator_type *)&local_a8);
  local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.stride = 0;
  local_a8.num_strips = 0;
  local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (mset->cache_num_indexes != (int)(this->parents).num_strips) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>(&local_158,mset);
    local_a8.num_strips = CONCAT44(local_158.num_strips._4_4_,(undefined4)local_158.num_strips);
    local_a8.stride = local_158.stride;
    ::std::vector<int,_std::allocator<int>_>::operator=(&local_a8.vec,&local_158.vec);
    if ((ulong *)local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  sVar4 = (this->parents).num_strips;
  local_130 = (ulong)(uint)mset->cache_num_indexes;
  local_110 = mset;
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)4>(&local_48,mset);
  iVar7 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_f0,(long)iVar7,(allocator_type *)&local_158);
  local_159 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_158,(long)local_110->cache_num_indexes,
             &local_159,&local_15a);
  local_118 = (ulong)(uint)this->top_level;
  local_128 = this;
  if (0 < this->top_level) {
    local_f8 = (ulong)(uint)(iVar7 * 2);
    local_108 = &this->parents;
    local_58 = &(this->parents).vec;
    local_60 = 0x800000000000003f;
    uVar16 = local_130;
    do {
      if (0 < (int)uVar16) {
        local_100 = 0;
        uVar9 = 0;
        do {
          pGVar5 = local_128;
          local_120 = uVar9;
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar9] == (int)local_118) {
            if (0 < (local_128->super_BaseCanonicalGrid).num_dimensions) {
              lVar10 = local_110->num_dimensions * local_100;
              piVar3 = (local_110->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar18 = 0;
              do {
                dVar20 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)4>
                                   (*(int *)((long)piVar3 + lVar18 * 4 + lVar10));
                local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18] = dVar20;
                lVar18 = lVar18 + 1;
              } while (lVar18 < (pGVar5->super_BaseCanonicalGrid).num_dimensions);
            }
            iVar7 = (int)local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
            piVar3 = local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar11 = (ulong *)local_158.stride;
            if ((pointer)local_158.stride !=
                local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              memset((void *)local_158.stride,0,
                     (long)local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start - local_158.stride);
              puVar11 = (ulong *)piVar3;
            }
            if (iVar7 != 0) {
              *puVar11 = *puVar11 & ~(0xffffffffffffffffU >> (-(char)iVar7 & 0x3fU));
            }
            *local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            *local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = (int)local_120;
            uVar16 = local_130;
            if (*local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)local_f8) {
              iVar7 = 0;
              uVar9 = local_f8;
              pDVar17 = local_108;
              do {
                pGVar5 = local_128;
                iVar1 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar7];
                if (iVar1 < (int)uVar9) {
                  bVar19 = (int)uVar16 == (int)sVar4;
                  pDVar8 = &local_a8;
                  if (bVar19) {
                    pDVar8 = pDVar17;
                  }
                  pvVar15 = &local_a8.vec;
                  if (bVar19) {
                    pvVar15 = local_58;
                  }
                  iVar2 = (pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start
                          [(long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar7] * pDVar8->stride +
                           (long)iVar1];
                  uVar13 = (ulong)iVar2;
                  if (uVar13 != 0xffffffffffffffff) {
                    uVar12 = uVar13 + 0x3f;
                    if (-1 < (long)uVar13) {
                      uVar12 = uVar13;
                    }
                    uVar14 = (ulong)((uVar13 & local_60) < 0x8000000000000001);
                    if ((*(ulong *)(local_158.stride + (((long)uVar12 >> 6) + (uVar14 - 1)) * 8) >>
                         (uVar13 & 0x3f) & 1) == 0) {
                      lVar10 = local_110->num_dimensions * uVar13;
                      piVar3 = (local_110->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_70 = uVar14;
                      local_68 = 1L << ((byte)iVar2 & 0x3f);
                      dVar20 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                                         (local_128->order,piVar3[lVar10],
                                          *local_f0.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
                      pGVar6 = local_128;
                      if (1 < (pGVar5->super_BaseCanonicalGrid).num_dimensions) {
                        lVar18 = 1;
                        do {
                          local_50 = dVar20;
                          dVar20 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                                             (pGVar6->order,piVar3[lVar10 + lVar18],
                                              local_f0.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start[lVar18]);
                          dVar20 = local_50 * dVar20;
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < (pGVar6->super_BaseCanonicalGrid).num_dimensions);
                      }
                      local_78[uVar13] = local_78[uVar13] - dVar20 * local_78[local_120];
                      *(ulong *)(local_158.stride + (((long)uVar12 >> 6) + (local_70 - 1)) * 8) =
                           *(ulong *)(local_158.stride + (((long)uVar12 >> 6) + (local_70 - 1)) * 8)
                           | local_68;
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar7 + 1] = 0;
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar7 + 1] = iVar2;
                      uVar16 = local_130;
                      uVar9 = local_f8;
                      pDVar17 = local_108;
                      iVar7 = iVar7 + 1;
                      goto LAB_001843ab;
                    }
                  }
                  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] = iVar1 + 1;
                }
                else {
                  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar7 + -1] =
                       local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar7 + -1] + 1;
                  iVar7 = iVar7 + -1;
                }
LAB_001843ab:
              } while (*local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar9);
            }
          }
          uVar9 = local_120 + 1;
          local_100 = local_100 + 4;
        } while (uVar9 != uVar16);
      }
      iVar7 = (int)local_118;
      local_118 = (ulong)(iVar7 - 1);
    } while (1 < iVar7);
  }
  if ((ulong *)local_158.stride != (ulong *)0x0) {
    operator_delete((void *)local_158.stride,
                    (long)local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_158.stride);
    local_158.stride = 0;
    local_158.num_strips._0_4_ = 0;
    local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    local_158.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::getQuadratureWeights(double *weights) const{
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    integrateHierarchicalFunctions(weights);

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);

    double basis_value;

    Data2D<int> lparents;
    if (parents.getNumStrips() != work.getNumIndexes())
        lparents = HierarchyManipulations::computeDAGup<effrule>(work);

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    int num_points = work.getNumIndexes();
    std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(work);

    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);
    std::vector<bool> used(work.getNumIndexes(), false);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);
                            weights[branch] -= weights[i] * basis_value;
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}